

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

LayoutDirection __thiscall QTextBlock::textDirection(QTextBlock *this)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  QTextDocumentPrivate *pQVar3;
  LayoutDirection LVar4;
  long lVar5;
  char16_t *pcVar6;
  wchar32 wVar7;
  long in_FS_OFFSET;
  long *local_78;
  undefined1 *puStack_70;
  long *local_68;
  undefined1 *puStack_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blockFormat((QTextBlock *)&local_50);
  LVar4 = QTextFormat::layoutDirection((QTextFormat *)&local_50);
  QTextFormat::~QTextFormat((QTextFormat *)&local_50);
  if (LVar4 == LayoutDirectionAuto) {
    pQVar3 = this->p;
    LVar4 = *(uint *)&pQVar3->defaultTextOption >> 0xe & (LayoutDirectionAuto|RightToLeft);
    if (LVar4 == LayoutDirectionAuto) {
      local_50.d = (pQVar3->text).d.d;
      local_50.ptr = (pQVar3->text).d.ptr;
      local_50.size = (pQVar3->text).d.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      position(this);
      local_68 = (long *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocumentPrivate::find((QTextDocumentPrivate *)&local_68,(int)this->p);
      local_78 = (long *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = this->p;
      length(this);
      QTextDocumentPrivate::find((QTextDocumentPrivate *)&local_78,(int)pQVar3);
      while( true ) {
        if ((local_68 == local_78) && ((int)puStack_60 == (int)puStack_70)) break;
        pcVar6 = local_50.ptr;
        if (local_50.ptr == (char16_t *)0x0) {
          pcVar6 = (char16_t *)&QString::_empty;
        }
        lVar5 = ((ulong)puStack_60 & 0xffffffff) * 0x20;
        pcVar6 = pcVar6 + *(int *)(*local_68 + 0x18 + lVar5);
        pcVar2 = pcVar6 + *(uint *)(*local_68 + 0x14 + lVar5);
        for (; pcVar6 < pcVar2; pcVar6 = pcVar6 + 1) {
          wVar7 = (wchar32)(ushort)*pcVar6;
          if ((((wVar7 & 0xfc00U) == 0xd800) && (pcVar1 = pcVar6 + 1, pcVar1 < pcVar2)) &&
             (((ushort)*pcVar1 & 0xfc00) == 0xdc00)) {
            wVar7 = (uint)(ushort)*pcVar6 * 0x400 + (uint)(ushort)*pcVar1 + L'\xfca02400';
            pcVar6 = pcVar1;
          }
          LVar4 = QChar::direction(wVar7);
          if (LVar4 == LeftToRight) goto LAB_004ab487;
          if ((LVar4 == RightToLeft) || (LVar4 == 0xd)) {
            LVar4 = RightToLeft;
            goto LAB_004ab487;
          }
        }
        QFragmentMap<QTextFragmentData>::ConstIterator::operator++((ConstIterator *)&local_68);
      }
      LVar4 = LeftToRight;
LAB_004ab487:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return LVar4;
}

Assistant:

Qt::LayoutDirection QTextBlock::textDirection() const
{
    Qt::LayoutDirection dir = blockFormat().layoutDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    dir = p->defaultTextOption.textDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    const QString buffer = p->buffer();

    const int pos = position();
    QTextDocumentPrivate::FragmentIterator it = p->find(pos);
    QTextDocumentPrivate::FragmentIterator end = p->find(pos + length() - 1); // -1 to omit the block separator char
    for (; it != end; ++it) {
        const QTextFragmentData * const frag = it.value();
        const QChar *p = buffer.constData() + frag->stringPosition;
        const QChar * const end = p + frag->size_array[0];
        while (p < end) {
            uint ucs4 = p->unicode();
            if (QChar::isHighSurrogate(ucs4) && p + 1 < end) {
                ushort low = p[1].unicode();
                if (QChar::isLowSurrogate(low)) {
                    ucs4 = QChar::surrogateToUcs4(ucs4, low);
                    ++p;
                }
            }
            switch (QChar::direction(ucs4)) {
            case QChar::DirL:
                return Qt::LeftToRight;
            case QChar::DirR:
            case QChar::DirAL:
                return Qt::RightToLeft;
            default:
                break;
            }
            ++p;
        }
    }
    return Qt::LeftToRight;
}